

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

CharPtr __thiscall
fmt::BasicWriter<wchar_t>::prepare_int_buffer<fmt::AlignSpec>
          (BasicWriter<wchar_t> *this,uint num_digits,AlignSpec *spec,char *prefix,uint prefix_size)

{
  wchar_t wVar1;
  Alignment AVar2;
  undefined8 *puVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  int *piVar7;
  CharPtr pwVar8;
  undefined8 *puVar9;
  ulong uVar10;
  long lVar11;
  uint uVar12;
  size_t size;
  long lVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  int *piVar18;
  uint uVar19;
  ulong uVar20;
  wchar_t __tmp;
  int iVar29;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  int iVar37;
  undefined1 auVar36 [16];
  AlignSpec subspec;
  AlignSpec local_3c;
  
  uVar10 = (ulong)num_digits;
  uVar19 = (spec->super_WidthSpec).width_;
  uVar20 = (ulong)uVar19;
  wVar1 = (spec->super_WidthSpec).fill_;
  AVar2 = spec->align_;
  if ((int)num_digits < -1) {
    if (prefix_size == 0) {
      prefix_size = 0;
    }
    else if (prefix[prefix_size - 1] == '0') {
      prefix_size = prefix_size - 1;
    }
    uVar12 = prefix_size - 1;
    local_3c.super_WidthSpec.fill_ = L'0';
    local_3c.align_ = ALIGN_NUMERIC;
    local_3c.super_WidthSpec.width_ = uVar12;
    if (uVar12 < uVar19) {
      puVar3 = *(undefined8 **)(this + 8);
      if ((ulong)puVar3[3] < uVar20) {
        (**(code **)*puVar3)(puVar3,uVar20);
      }
      uVar19 = uVar19 - uVar12;
      if (AVar2 == ALIGN_LEFT) {
        pwVar8 = prepare_int_buffer<fmt::AlignSpec>(this,num_digits,&local_3c,prefix,prefix_size);
        puVar3 = *(undefined8 **)(this + 8);
        lVar15 = puVar3[2];
        uVar10 = lVar15 + (ulong)uVar19;
        puVar9 = puVar3;
        if ((ulong)puVar3[3] < uVar10) {
          (**(code **)*puVar3)(puVar3,uVar10);
          puVar9 = *(undefined8 **)(this + 8);
        }
        puVar3[2] = uVar10;
        auVar6 = _DAT_0037d170;
        auVar5 = _DAT_0037d140;
        auVar4 = _DAT_0037d130;
        uVar20 = (ulong)uVar19 + 0x3fffffffffffffff;
        uVar10 = uVar20 & 0x3fffffffffffffff;
        auVar23._8_4_ = (int)uVar10;
        auVar23._0_8_ = uVar10;
        auVar23._12_4_ = (int)(uVar10 >> 0x20);
        lVar15 = puVar9[1] + lVar15 * 4;
        lVar11 = 0;
        auVar23 = auVar23 ^ _DAT_0037d140;
        do {
          auVar31._8_4_ = (int)lVar11;
          auVar31._0_8_ = lVar11;
          auVar31._12_4_ = (int)((ulong)lVar11 >> 0x20);
          auVar36 = (auVar31 | auVar4) ^ auVar5;
          iVar29 = auVar23._4_4_;
          if ((bool)(~(auVar36._4_4_ == iVar29 && auVar23._0_4_ < auVar36._0_4_ ||
                      iVar29 < auVar36._4_4_) & 1)) {
            *(wchar_t *)(lVar15 + lVar11 * 4) = wVar1;
          }
          if ((auVar36._12_4_ != auVar23._12_4_ || auVar36._8_4_ <= auVar23._8_4_) &&
              auVar36._12_4_ <= auVar23._12_4_) {
            *(wchar_t *)(lVar15 + 4 + lVar11 * 4) = wVar1;
          }
          auVar31 = (auVar31 | auVar6) ^ auVar5;
          iVar37 = auVar31._4_4_;
          if (iVar37 <= iVar29 && (iVar37 != iVar29 || auVar31._0_4_ <= auVar23._0_4_)) {
            *(wchar_t *)(lVar15 + 8 + lVar11 * 4) = wVar1;
            *(wchar_t *)(lVar15 + 0xc + lVar11 * 4) = wVar1;
          }
          lVar11 = lVar11 + 4;
        } while ((uVar10 - ((uint)uVar20 & 3)) + 4 != lVar11);
        return pwVar8;
      }
      puVar3 = *(undefined8 **)(this + 8);
      lVar15 = puVar3[2];
      uVar10 = lVar15 + (ulong)uVar19;
      puVar9 = puVar3;
      if ((ulong)puVar3[3] < uVar10) {
        (**(code **)*puVar3)(puVar3,uVar10);
        puVar9 = *(undefined8 **)(this + 8);
      }
      puVar3[2] = uVar10;
      auVar6 = _DAT_0037d170;
      auVar5 = _DAT_0037d140;
      auVar4 = _DAT_0037d130;
      uVar20 = (ulong)uVar19 + 0x3fffffffffffffff;
      uVar10 = uVar20 & 0x3fffffffffffffff;
      auVar36._8_4_ = (int)uVar10;
      auVar36._0_8_ = uVar10;
      auVar36._12_4_ = (int)(uVar10 >> 0x20);
      lVar15 = puVar9[1] + lVar15 * 4;
      lVar11 = 0;
      auVar36 = auVar36 ^ _DAT_0037d140;
      do {
        auVar32._8_4_ = (int)lVar11;
        auVar32._0_8_ = lVar11;
        auVar32._12_4_ = (int)((ulong)lVar11 >> 0x20);
        auVar23 = (auVar32 | auVar4) ^ auVar5;
        iVar29 = auVar36._4_4_;
        if ((bool)(~(auVar23._4_4_ == iVar29 && auVar36._0_4_ < auVar23._0_4_ ||
                    iVar29 < auVar23._4_4_) & 1)) {
          *(wchar_t *)(lVar15 + lVar11 * 4) = wVar1;
        }
        if ((auVar23._12_4_ != auVar36._12_4_ || auVar23._8_4_ <= auVar36._8_4_) &&
            auVar23._12_4_ <= auVar36._12_4_) {
          *(wchar_t *)(lVar15 + 4 + lVar11 * 4) = wVar1;
        }
        auVar23 = (auVar32 | auVar6) ^ auVar5;
        iVar37 = auVar23._4_4_;
        if (iVar37 <= iVar29 && (iVar37 != iVar29 || auVar23._0_4_ <= auVar36._0_4_)) {
          *(wchar_t *)(lVar15 + 8 + lVar11 * 4) = wVar1;
          *(wchar_t *)(lVar15 + 0xc + lVar11 * 4) = wVar1;
        }
        lVar11 = lVar11 + 4;
      } while ((uVar10 - ((uint)uVar20 & 3)) + 4 != lVar11);
    }
    pwVar8 = prepare_int_buffer<fmt::AlignSpec>(this,num_digits,&local_3c,prefix,prefix_size);
    return pwVar8;
  }
  uVar12 = prefix_size + num_digits;
  puVar3 = *(undefined8 **)(this + 8);
  lVar15 = puVar3[2];
  if (uVar19 <= uVar12) {
    uVar10 = (ulong)uVar12 + lVar15;
    puVar9 = puVar3;
    if ((ulong)puVar3[3] < uVar10) {
      (**(code **)*puVar3)(puVar3,uVar10);
      puVar9 = *(undefined8 **)(this + 8);
    }
    puVar3[2] = uVar10;
    lVar15 = lVar15 * 4 + puVar9[1];
    if (prefix_size != 0) {
      uVar10 = (ulong)prefix_size + 1;
      lVar11 = 0;
      do {
        *(int *)(lVar15 + lVar11 * 4) = (int)prefix[lVar11];
        uVar10 = uVar10 - 1;
        lVar11 = lVar11 + 1;
      } while (1 < uVar10);
    }
    piVar7 = (int *)((ulong)uVar12 * 4 + lVar15);
    goto LAB_00376209;
  }
  uVar14 = uVar20 + lVar15;
  puVar9 = puVar3;
  if ((ulong)puVar3[3] < uVar14) {
    (**(code **)*puVar3)(puVar3,uVar14);
    puVar9 = *(undefined8 **)(this + 8);
  }
  puVar3[2] = uVar14;
  auVar6 = _DAT_0037d170;
  auVar5 = _DAT_0037d140;
  auVar4 = _DAT_0037d130;
  lVar11 = puVar9[1];
  piVar18 = (int *)(lVar11 + lVar15 * 4);
  piVar7 = piVar18 + uVar20;
  if (AVar2 == ALIGN_NUMERIC) {
    if (prefix_size == 0) {
LAB_003760ee:
      uVar10 = (ulong)uVar12;
    }
    else {
      uVar20 = (ulong)prefix_size + 1;
      do {
        *piVar18 = (int)*prefix;
        prefix = prefix + 1;
        piVar18 = piVar18 + 1;
        uVar20 = uVar20 - 1;
      } while (1 < uVar20);
    }
  }
  else {
    if (AVar2 == ALIGN_CENTER) {
      uVar10 = (ulong)uVar12;
      uVar14 = uVar20 - uVar10 >> 1;
      if (1 < uVar20 - uVar10) {
        uVar16 = uVar14 + 0x3fffffffffffffff & 0x3fffffffffffffff;
        auVar24._8_4_ = (int)uVar16;
        auVar24._0_8_ = uVar16;
        auVar24._12_4_ = (int)(uVar16 >> 0x20);
        lVar13 = lVar11 + lVar15 * 4;
        lVar17 = 0;
        auVar24 = auVar24 ^ _DAT_0037d140;
        do {
          auVar33._8_4_ = (int)lVar17;
          auVar33._0_8_ = lVar17;
          auVar33._12_4_ = (int)((ulong)lVar17 >> 0x20);
          auVar23 = (auVar33 | auVar4) ^ auVar5;
          iVar29 = auVar24._4_4_;
          if ((bool)(~(auVar23._4_4_ == iVar29 && auVar24._0_4_ < auVar23._0_4_ ||
                      iVar29 < auVar23._4_4_) & 1)) {
            *(wchar_t *)(lVar13 + lVar17 * 4) = wVar1;
          }
          if ((auVar23._12_4_ != auVar24._12_4_ || auVar23._8_4_ <= auVar24._8_4_) &&
              auVar23._12_4_ <= auVar24._12_4_) {
            *(wchar_t *)(lVar13 + 4 + lVar17 * 4) = wVar1;
          }
          auVar23 = (auVar33 | auVar6) ^ auVar5;
          iVar37 = auVar23._4_4_;
          if (iVar37 <= iVar29 && (iVar37 != iVar29 || auVar23._0_4_ <= auVar24._0_4_)) {
            *(wchar_t *)(lVar13 + 8 + lVar17 * 4) = wVar1;
            *(wchar_t *)(lVar13 + 0xc + lVar17 * 4) = wVar1;
          }
          lVar17 = lVar17 + 4;
        } while ((uVar16 - ((uint)(uVar14 + 0x3fffffffffffffff) & 3)) + 4 != lVar17);
      }
      auVar6 = _DAT_0037d170;
      auVar5 = _DAT_0037d140;
      auVar4 = _DAT_0037d130;
      piVar7 = piVar18 + uVar14 + uVar10;
      uVar20 = (uVar20 * 4 + (uVar14 + uVar10) * -4) - 4;
      auVar25._8_4_ = (int)uVar20;
      auVar25._0_8_ = uVar20;
      auVar25._12_4_ = (int)(uVar20 >> 0x20);
      auVar26._0_8_ = uVar20 >> 2;
      auVar26._8_8_ = auVar25._8_8_ >> 2;
      lVar11 = lVar11 + uVar14 * 4 + lVar15 * 4 + uVar10 * 4;
      uVar10 = 0;
      auVar26 = auVar26 ^ _DAT_0037d140;
      do {
        auVar34._8_4_ = (int)uVar10;
        auVar34._0_8_ = uVar10;
        auVar34._12_4_ = (int)(uVar10 >> 0x20);
        auVar23 = (auVar34 | auVar4) ^ auVar5;
        iVar29 = auVar26._4_4_;
        if ((bool)(~(auVar23._4_4_ == iVar29 && auVar26._0_4_ < auVar23._0_4_ ||
                    iVar29 < auVar23._4_4_) & 1)) {
          *(wchar_t *)(lVar11 + uVar10 * 4) = wVar1;
        }
        if ((auVar23._12_4_ != auVar26._12_4_ || auVar23._8_4_ <= auVar26._8_4_) &&
            auVar23._12_4_ <= auVar26._12_4_) {
          *(wchar_t *)(lVar11 + 4 + uVar10 * 4) = wVar1;
        }
        auVar23 = (auVar34 | auVar6) ^ auVar5;
        iVar37 = auVar23._4_4_;
        if (iVar37 <= iVar29 && (iVar37 != iVar29 || auVar23._0_4_ <= auVar26._0_4_)) {
          *(wchar_t *)(lVar11 + 8 + uVar10 * 4) = wVar1;
          *(wchar_t *)(lVar11 + 0xc + uVar10 * 4) = wVar1;
        }
        uVar10 = uVar10 + 4;
      } while (((uVar20 >> 2) + 4 & 0xfffffffffffffffc) != uVar10);
      if (prefix_size != 0) {
        uVar10 = (ulong)prefix_size + 1;
        lVar15 = 0;
        do {
          piVar18[uVar14 + lVar15] = (int)prefix[lVar15];
          uVar10 = uVar10 - 1;
          lVar15 = lVar15 + 1;
        } while (1 < uVar10);
      }
      goto LAB_00376209;
    }
    if (AVar2 == ALIGN_LEFT) {
      if (prefix_size != 0) {
        uVar10 = (ulong)prefix_size + 1;
        lVar13 = 0;
        do {
          piVar18[lVar13] = (int)prefix[lVar13];
          uVar10 = uVar10 - 1;
          lVar13 = lVar13 + 1;
        } while (1 < uVar10);
      }
      auVar6 = _DAT_0037d170;
      auVar5 = _DAT_0037d140;
      auVar4 = _DAT_0037d130;
      uVar10 = (ulong)uVar12;
      piVar7 = piVar18 + uVar10;
      uVar20 = (uVar20 * 4 + uVar10 * -4) - 4;
      auVar21._8_4_ = (int)uVar20;
      auVar21._0_8_ = uVar20;
      auVar21._12_4_ = (int)(uVar20 >> 0x20);
      auVar22._0_8_ = uVar20 >> 2;
      auVar22._8_8_ = auVar21._8_8_ >> 2;
      lVar11 = lVar11 + uVar10 * 4 + lVar15 * 4;
      uVar10 = 0;
      auVar22 = auVar22 ^ _DAT_0037d140;
      do {
        auVar30._8_4_ = (int)uVar10;
        auVar30._0_8_ = uVar10;
        auVar30._12_4_ = (int)(uVar10 >> 0x20);
        auVar23 = (auVar30 | auVar4) ^ auVar5;
        iVar29 = auVar22._4_4_;
        if ((bool)(~(auVar23._4_4_ == iVar29 && auVar22._0_4_ < auVar23._0_4_ ||
                    iVar29 < auVar23._4_4_) & 1)) {
          *(wchar_t *)(lVar11 + uVar10 * 4) = wVar1;
        }
        if ((auVar23._12_4_ != auVar22._12_4_ || auVar23._8_4_ <= auVar22._8_4_) &&
            auVar23._12_4_ <= auVar22._12_4_) {
          *(wchar_t *)(lVar11 + 4 + uVar10 * 4) = wVar1;
        }
        auVar23 = (auVar30 | auVar6) ^ auVar5;
        iVar37 = auVar23._4_4_;
        if (iVar37 <= iVar29 && (iVar37 != iVar29 || auVar23._0_4_ <= auVar22._0_4_)) {
          *(wchar_t *)(lVar11 + 8 + uVar10 * 4) = wVar1;
          *(wchar_t *)(lVar11 + 0xc + uVar10 * 4) = wVar1;
        }
        uVar10 = uVar10 + 4;
      } while (((uVar20 >> 2) + 4 & 0xfffffffffffffffc) != uVar10);
      goto LAB_00376209;
    }
    if (prefix_size == 0) goto LAB_003760ee;
    uVar10 = (ulong)uVar12;
    uVar20 = (ulong)prefix_size + 1;
    lVar15 = 0;
    do {
      piVar7[lVar15 - (ulong)uVar12] = (int)prefix[lVar15];
      uVar20 = uVar20 - 1;
      lVar15 = lVar15 + 1;
    } while (1 < uVar20);
  }
  auVar6 = _DAT_0037d170;
  auVar5 = _DAT_0037d140;
  auVar4 = _DAT_0037d130;
  if (piVar18 != piVar7 + -uVar10) {
    uVar10 = ((lVar11 + uVar14 * 4) - (long)(piVar18 + uVar10)) - 4;
    auVar27._8_4_ = (int)uVar10;
    auVar27._0_8_ = uVar10;
    auVar27._12_4_ = (int)(uVar10 >> 0x20);
    auVar28._0_8_ = uVar10 >> 2;
    auVar28._8_8_ = auVar27._8_8_ >> 2;
    uVar20 = 0;
    auVar28 = auVar28 ^ _DAT_0037d140;
    do {
      auVar35._8_4_ = (int)uVar20;
      auVar35._0_8_ = uVar20;
      auVar35._12_4_ = (int)(uVar20 >> 0x20);
      auVar23 = (auVar35 | auVar4) ^ auVar5;
      iVar29 = auVar28._4_4_;
      if ((bool)(~(auVar23._4_4_ == iVar29 && auVar28._0_4_ < auVar23._0_4_ ||
                  iVar29 < auVar23._4_4_) & 1)) {
        piVar18[uVar20] = wVar1;
      }
      if ((auVar23._12_4_ != auVar28._12_4_ || auVar23._8_4_ <= auVar28._8_4_) &&
          auVar23._12_4_ <= auVar28._12_4_) {
        piVar18[uVar20 + 1] = wVar1;
      }
      auVar23 = (auVar35 | auVar6) ^ auVar5;
      iVar37 = auVar23._4_4_;
      if (iVar37 <= iVar29 && (iVar37 != iVar29 || auVar23._0_4_ <= auVar28._0_4_)) {
        piVar18[uVar20 + 2] = wVar1;
        piVar18[uVar20 + 3] = wVar1;
      }
      uVar20 = uVar20 + 4;
    } while (((uVar10 >> 2) + 4 & 0xfffffffffffffffc) != uVar20);
  }
LAB_00376209:
  return piVar7 + -1;
}

Assistant:

typename BasicWriter<Char>::CharPtr
  BasicWriter<Char>::prepare_int_buffer(
    unsigned num_digits, const Spec &spec,
    const char *prefix, unsigned prefix_size) {
  unsigned width = spec.width();
  Alignment align = spec.align();
  Char fill = internal::CharTraits<Char>::cast(spec.fill());
  if (spec.precision() > static_cast<int>(num_digits)) {
    // Octal prefix '0' is counted as a digit, so ignore it if precision
    // is specified.
    if (prefix_size > 0 && prefix[prefix_size - 1] == '0')
      --prefix_size;
    unsigned number_size =
        prefix_size + internal::to_unsigned(spec.precision());
    AlignSpec subspec(number_size, '0', ALIGN_NUMERIC);
    if (number_size >= width)
      return prepare_int_buffer(num_digits, subspec, prefix, prefix_size);
    buffer_.reserve(width);
    unsigned fill_size = width - number_size;
    if (align != ALIGN_LEFT) {
      CharPtr p = grow_buffer(fill_size);
      std::uninitialized_fill(p, p + fill_size, fill);
    }
    CharPtr result = prepare_int_buffer(
        num_digits, subspec, prefix, prefix_size);
    if (align == ALIGN_LEFT) {
      CharPtr p = grow_buffer(fill_size);
      std::uninitialized_fill(p, p + fill_size, fill);
    }
    return result;
  }
  unsigned size = prefix_size + num_digits;
  if (width <= size) {
    CharPtr p = grow_buffer(size);
    std::uninitialized_copy(prefix, prefix + prefix_size, p);
    return p + size - 1;
  }
  CharPtr p = grow_buffer(width);
  CharPtr end = p + width;
  if (align == ALIGN_LEFT) {
    std::uninitialized_copy(prefix, prefix + prefix_size, p);
    p += size;
    std::uninitialized_fill(p, end, fill);
  } else if (align == ALIGN_CENTER) {
    p = fill_padding(p, width, size, fill);
    std::uninitialized_copy(prefix, prefix + prefix_size, p);
    p += size;
  } else {
    if (align == ALIGN_NUMERIC) {
      if (prefix_size != 0) {
        p = std::uninitialized_copy(prefix, prefix + prefix_size, p);
        size -= prefix_size;
      }
    } else {
      std::uninitialized_copy(prefix, prefix + prefix_size, end - size);
    }
    std::uninitialized_fill(p, end - size, fill);
    p = end;
  }
  return p - 1;
}